

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O0

Print * __thiscall amrex::Print::operator<<(Print *this,char **x)

{
  undefined8 *in_RSI;
  Print *in_RDI;
  
  std::operator<<((ostream *)&in_RDI->ss,(char *)*in_RSI);
  return in_RDI;
}

Assistant:

Print& operator<< (const T& x) {
            ss << x;
            return *this;
        }